

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notification.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::Notification::WaitForNotificationWithDeadline(Notification *this,Time deadline)

{
  bool bVar1;
  KernelTimeout local_58;
  code *local_50;
  char local_48 [8];
  code *local_40;
  atomic<bool> *local_38;
  
  AbslInternalTraceWait_lts_20250127(this,kNotification);
  bVar1 = true;
  if (((this->notified_yet_)._M_base._M_i & 1U) == 0) {
    local_38 = &this->notified_yet_;
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_40 = Condition::CastAndCallFunction<std::atomic<bool>const>;
    local_50 = HasBeenNotifiedInternal;
    synchronization_internal::KernelTimeout::KernelTimeout(&local_58,deadline);
    bVar1 = Mutex::LockWhenCommon(&this->mutex_,(Condition *)&local_50,local_58,true);
    Mutex::Unlock(&this->mutex_);
    if (!bVar1) {
      this = (Notification *)0x0;
    }
  }
  AbslInternalTraceContinue_lts_20250127(this,kNotification);
  return bVar1;
}

Assistant:

bool Notification::WaitForNotificationWithDeadline(absl::Time deadline) const {
  base_internal::TraceWait(this, TraceObjectKind());
  bool notified = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!notified) {
    notified = this->mutex_.LockWhenWithDeadline(
        Condition(&HasBeenNotifiedInternal, &this->notified_yet_), deadline);
    this->mutex_.Unlock();
  }
  base_internal::TraceContinue(notified ? this : nullptr, TraceObjectKind());
  return notified;
}